

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall
dlib::resizable_tensor::resizable_tensor(resizable_tensor *this,resizable_tensor *item)

{
  _func_void_ptr_void_ptr *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar4;
  size_t __n;
  undefined1 auVar5 [32];
  long *plVar3;
  
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_tensor).m_n = auVar5._0_8_;
  (this->super_tensor).m_k = auVar5._8_8_;
  (this->super_tensor).m_nr = auVar5._16_8_;
  (this->super_tensor).m_nc = auVar5._24_8_;
  (this->super_tensor).m_size = 0;
  (this->data_instance).data_size = 0;
  (this->super_tensor)._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->data_instance).host_current = true;
  (this->data_instance).device_current = true;
  (this->data_instance).have_active_transfer = false;
  (this->data_instance).device_in_use = false;
  (this->data_instance).data_host = (shared_ptr<float>)auVar5._0_16_;
  (this->data_instance).data_device = (shared_ptr<float>)auVar5._16_16_;
  *(undefined1 (*) [32])
   ((long)&(this->data_instance).data_device.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  iVar2 = (*(item->super_tensor)._vptr_tensor[8])(item);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (*plVar3 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (void *)(*(code *)plVar3[2])();
  }
  (this->_annotation).storage.ptr = pvVar4;
  p_Var1 = (_func_void_ptr_void_ptr *)plVar3[2];
  (this->_annotation).storage.del = (_func_void_void_ptr *)plVar3[1];
  (this->_annotation).storage.copy = p_Var1;
  (this->_annotation).storage.type_id_ = (_func_type_index *)plVar3[3];
  copy_size(this,&item->super_tensor);
  memcpy(this,item,__n);
  return;
}

Assistant:

resizable_tensor(const resizable_tensor& item) : _annotation(item.annotation()) 
        {
            copy_size(item);
            memcpy(*this, item);
        }